

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O2

void __thiscall DBaseStatusBar::DrSmallNumber(DBaseStatusBar *this,int val,int x,int y)

{
  FTexture *pFVar1;
  uint uVar2;
  
  uVar2 = 999;
  if (val < 999) {
    uVar2 = val;
  }
  if (val < 100) {
    if (val < 10) goto LAB_004bf4ba;
  }
  else {
    pFVar1 = FImageCollection::operator[](&this->Images,uVar2 / 100 + 0x17);
    DrawImage(this,pFVar1,x,y,(FRemapTable *)0x0);
    uVar2 = uVar2 % 100;
  }
  pFVar1 = FImageCollection::operator[](&this->Images,(int)uVar2 / 10 + 0x17);
  DrawImage(this,pFVar1,x + 4,y,(FRemapTable *)0x0);
  uVar2 = (int)uVar2 % 10;
LAB_004bf4ba:
  pFVar1 = FImageCollection::operator[](&this->Images,uVar2 + 0x17);
  DrawImage(this,pFVar1,x + 8,y,(FRemapTable *)0x0);
  return;
}

Assistant:

void DBaseStatusBar::DrSmallNumber (int val, int x, int y) const
{
	int digit = 0;

	if (val > 999)
	{
		val = 999;
	}
	if (val > 99)
	{
		digit = val / 100;
		DrawImage (Images[imgSmNumbers + digit], x, y);
		val -= digit * 100;
	}
	if (val > 9 || digit)
	{
		digit = val / 10;
		DrawImage (Images[imgSmNumbers + digit], x+4, y);
		val -= digit * 10;
	}
	DrawImage (Images[imgSmNumbers + val], x+8, y);
}